

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

bool __thiscall
ddd::DaTrie<false,_false,_true>::search_prefix(DaTrie<false,_false,_true> *this,Query *query)

{
  pointer pBVar1;
  ulong uVar2;
  Bc BVar3;
  uint32_t uVar4;
  uint uVar5;
  
  uVar2 = (ulong)query->node_pos_;
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pBVar1 >> 3) <= uVar2) {
    __assert_fail("query.node_pos() < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0xf9,
                  "bool ddd::DaTrie<false, false, true>::search_prefix(Query &) const [WithBLM = false, WithNLM = false, Prefix = true]"
                 );
  }
  BVar3 = pBVar1[uVar2];
  if (-1 < (long)BVar3) {
    __assert_fail("bc_[query.node_pos()].is_fixed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0xfa,
                  "bool ddd::DaTrie<false, false, true>::search_prefix(Query &) const [WithBLM = false, WithNLM = false, Prefix = true]"
                 );
  }
  if (-1 < BVar3._0_4_) {
    uVar4 = query->pos_;
    do {
      if (BVar3._0_4_ == 0x7fffffff) {
        return false;
      }
      uVar5 = (uint)(byte)query->key_[uVar4] ^ BVar3._0_4_;
      if ((*(uint *)&pBVar1[uVar5].field_0x4 & 0x7fffffff) != (uint)uVar2) {
        return false;
      }
      query->node_pos_ = uVar5;
      query->pos_ = uVar4 + 1;
      query->is_finished_ = query->key_[uVar4] == '\0';
      BVar3 = pBVar1[uVar5];
      uVar2 = (ulong)uVar5;
      uVar4 = uVar4 + 1;
    } while (-1 < BVar3._0_4_);
  }
  query->value_ = BVar3._0_4_ & 0x7fffffff;
  return true;
}

Assistant:

bool search_prefix(Query& query) const {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());
    assert(Prefix);

    while (!bc_[query.node_pos()].is_leaf()) {
      auto base = bc_[query.node_pos()].base();
      if (base == INVALID_VALUE) {
        return false;
      }
      auto child_pos = base ^query.label();
      if (bc_[child_pos].check() != query.node_pos()) {
        return false;
      }
      query.next(child_pos);
    }

    query.set_value(bc_[query.node_pos()].value());
    return true;
  }